

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

bool __thiscall SQCompiler::Compile(SQCompiler *this,SQObjectPtr *o)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQFuncState *pSVar4;
  SQTable *pSVar5;
  SQCOMPILERERROR p_Var6;
  SQVM *pSVar7;
  SQDelegable *pSVar8;
  int iVar9;
  SQObjectValue SVar10;
  SQInteger n;
  SQString *pSVar11;
  long lVar12;
  SQFunctionProto *pSVar13;
  SQChar *pSVar14;
  SQObject SVar15;
  SQFuncState funcstate;
  SQObject local_248;
  SQFuncState local_238;
  
  this->_debugline = 1;
  this->_debugop = 0;
  SQFuncState::SQFuncState(&local_238,this->_vm->_sharedstate,(SQFuncState *)0x0,ThrowError,this);
  SVar10.pString = SQString::Create(this->_vm->_sharedstate,"main",-1);
  SVar2 = local_238._name.super_SQObject._type;
  local_238._name.super_SQObject._type = OT_STRING;
  pSVar1 = &((SVar10.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &((local_238._name.super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      pSVar8 = &(local_238._name.super_SQObject._unVal.pTable)->super_SQDelegable;
      local_238._name.super_SQObject._unVal.pString = SVar10.pString;
      (*(pSVar8->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
      SVar10 = local_238._name.super_SQObject._unVal;
    }
  }
  local_238._name.super_SQObject._unVal = SVar10;
  this->_fs = &local_238;
  SVar15 = SQFuncState::CreateString(&local_238,"this",-1);
  local_248._unVal = SVar15._unVal;
  local_248._type = SVar15._type;
  SQFuncState::AddParameter(&local_238,&local_248);
  pSVar4 = this->_fs;
  SVar15 = SQFuncState::CreateString(pSVar4,"vargv",-1);
  local_248._unVal = SVar15._unVal;
  local_248._type = SVar15._type;
  SQFuncState::AddParameter(pSVar4,&local_248);
  pSVar4 = this->_fs;
  pSVar4->_varparams = true;
  SVar2 = (pSVar4->_sourcename).super_SQObject._type;
  pSVar5 = (pSVar4->_sourcename).super_SQObject._unVal.pTable;
  (pSVar4->_sourcename).super_SQObject._unVal = (this->_sourcename).super_SQObject._unVal;
  SVar3 = (this->_sourcename).super_SQObject._type;
  (pSVar4->_sourcename).super_SQObject._type = SVar3;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(((pSVar4->_sourcename).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  n = SQFuncState::GetStackSize(this->_fs);
  iVar9 = _setjmp((__jmp_buf_tag *)this->_errorjmp);
  if (iVar9 == 0) {
    lVar12 = SQLexer::Lex(&this->_lex);
    this->_token = lVar12;
    while (0 < lVar12) {
      Statement(this,true);
      lVar12 = (this->_lex)._prevtoken;
      if ((lVar12 != 0x3b) && (lVar12 != 0x7d)) {
        OptionalSemicolon(this);
      }
      lVar12 = this->_token;
    }
    SQFuncState::SetStackSize(this->_fs,n);
    SQFuncState::AddLineInfos(this->_fs,(this->_lex)._currentline,this->_lineinfo,true);
    local_248._type = 0;
    local_248._4_4_ = 0xff17;
    SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_248);
    SQFuncState::SetStackSize(this->_fs,0);
    pSVar13 = SQFuncState::BuildProto(this->_fs);
    pSVar5 = (o->super_SQObject)._unVal.pTable;
    SVar2 = (o->super_SQObject)._type;
    (o->super_SQObject)._type = OT_FUNCPROTO;
    (o->super_SQObject)._unVal.pFunctionProto = pSVar13;
    pSVar1 = &(pSVar13->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  else {
    if (this->_raiseerror == true) {
      p_Var6 = this->_vm->_sharedstate->_compilererrorhandler;
      if (p_Var6 != (SQCOMPILERERROR)0x0) {
        pSVar14 = "unknown";
        if ((this->_sourcename).super_SQObject._type == OT_STRING) {
          pSVar14 = ((this->_sourcename).super_SQObject._unVal.pString)->_val;
        }
        (*p_Var6)(this->_vm,this->_compilererror,pSVar14,(this->_lex)._currentline,
                  (this->_lex)._currentcolumn);
      }
    }
    pSVar11 = SQString::Create(this->_vm->_sharedstate,this->_compilererror,-1);
    pSVar7 = this->_vm;
    pSVar5 = (pSVar7->_lasterror).super_SQObject._unVal.pTable;
    SVar2 = (pSVar7->_lasterror).super_SQObject._type;
    (pSVar7->_lasterror).super_SQObject._type = OT_STRING;
    (pSVar7->_lasterror).super_SQObject._unVal.pString = pSVar11;
    pSVar1 = &(pSVar11->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                (pSVar5);
    }
  }
  SQFuncState::~SQFuncState(&local_238);
  return iVar9 == 0;
}

Assistant:

bool Compile(SQObjectPtr &o)
    {
        _debugline = 1;
        _debugop = 0;

        SQFuncState funcstate(_ss(_vm), NULL,ThrowError,this);
        funcstate._name = SQString::Create(_ss(_vm), _SC("main"));
        _fs = &funcstate;
        _fs->AddParameter(_fs->CreateString(_SC("this")));
        _fs->AddParameter(_fs->CreateString(_SC("vargv")));
        _fs->_varparams = true;
        _fs->_sourcename = _sourcename;
        SQInteger stacksize = _fs->GetStackSize();
        if(setjmp(_errorjmp) == 0) {
            Lex();
            while(_token > 0){
                Statement();
                if(_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
            }
            _fs->SetStackSize(stacksize);
            _fs->AddLineInfos(_lex._currentline, _lineinfo, true);
            _fs->AddInstruction(_OP_RETURN, 0xFF);
            _fs->SetStackSize(0);
            o =_fs->BuildProto();
#ifdef _DEBUG_DUMP
            _fs->Dump(_funcproto(o));
#endif
        }
        else {
            if(_raiseerror && _ss(_vm)->_compilererrorhandler) {
                _ss(_vm)->_compilererrorhandler(_vm, _compilererror, type(_sourcename) == OT_STRING?_stringval(_sourcename):_SC("unknown"),
                    _lex._currentline, _lex._currentcolumn);
            }
            _vm->_lasterror = SQString::Create(_ss(_vm), _compilererror, -1);
            return false;
        }
        return true;
    }